

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O2

Vector4 Vector4Add(Vector4 v1,Vector4 v2)

{
  Vector4 VVar1;
  
  VVar1.x = v1.x + v2.x;
  VVar1.y = v1.y + v2.y;
  VVar1.z = v1.z + v2.z;
  VVar1.w = v1.w + v2.w;
  return VVar1;
}

Assistant:

RMAPI Vector4 Vector4Add(Vector4 v1, Vector4 v2)
{
    Vector4 result = {
        v1.x + v2.x,
        v1.y + v2.y,
        v1.z + v2.z,
        v1.w + v2.w
    };
    return result;
}